

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.h
# Opt level: O2

void __thiscall
cmQtAutoGeneratorMocUic::JobUicT::JobUicT
          (JobUicT *this,string *sourceFile,string *includerFile,string *includeString)

{
  (this->super_JobT)._vptr_JobT = (_func_int **)&PTR__JobUicT_0055d830;
  std::__cxx11::string::string((string *)&this->SourceFile,(string *)sourceFile);
  std::__cxx11::string::string((string *)&this->IncluderFile,(string *)includerFile);
  std::__cxx11::string::string((string *)&this->IncludeString,(string *)includeString);
  (this->BuildFile)._M_dataplus._M_p = (pointer)&(this->BuildFile).field_2;
  (this->BuildFile)._M_string_length = 0;
  (this->BuildFile).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

JobUicT(std::string&& sourceFile, std::string includerFile,
            std::string&& includeString)
      : SourceFile(std::move(sourceFile))
      , IncluderFile(std::move(includerFile))
      , IncludeString(std::move(includeString))
    {
    }